

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::visitUnary
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermUnary *node)

{
  Builder *this_00;
  AccessChain *pAVar1;
  TSpirvInstruction *__lhs;
  bool bVar2;
  TPrecisionQualifier TVar3;
  SpvBuildLogger *this_01;
  TIntermUnary *pTVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Id IVar8;
  Id IVar9;
  Id IVar10;
  TOperator TVar11;
  CoherentFlags CVar12;
  TBasicType TVar13;
  uint uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  Decoration DVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TType *pTVar19;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long *plVar20;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long *plVar21;
  undefined4 extraout_var_10;
  TGlslangToSpvTraverser *pTVar22;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TQualifier *qualifier;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  long lVar23;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  TPrecisionQualifier TVar24;
  Op OVar25;
  bool forwardReferenceOnly;
  bool forwardReferenceOnly_00;
  bool forwardReferenceOnly_01;
  bool forwardReferenceOnly_02;
  char *filename;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literals_00;
  Op OVar26;
  undefined4 in_register_00000034;
  uint uVar27;
  TBasicType type;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  Id local_124;
  TIntermUnary *node_local;
  uint local_118;
  Id local_114;
  TGlslangToSpvTraverser *local_110;
  Id invertedType;
  undefined8 local_100;
  CoherentFlags lvalueCoherentFlags;
  OpDecorations decorations;
  anon_class_24_3_db054092 resultType;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  TVector<const_glslang::TIntermConstantUnion_*> constants;
  CoherentFlags local_48 [4];
  TIntermConstantUnion *local_38;
  
  this_00 = &this->builder;
  node_local = node;
  iVar6 = (**(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode)
                    (node,CONCAT44(in_register_00000034,param_1));
  iVar6 = *(int *)(CONCAT44(extraout_var,iVar6) + 0xc);
  iVar7 = (**(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode)
                    (node);
  if (*(long *)CONCAT44(extraout_var_00,iVar7) == 0) {
    filename = (char *)0x0;
  }
  else {
    filename = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 8);
  }
  spv::Builder::setDebugSourceLocation(this_00,iVar6,filename);
  bVar2 = (this->builder).generatingOpCodeForSpecConst;
  iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1e])(node);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x58))
                     ((long *)CONCAT44(extraout_var_01,iVar6));
  if ((*(byte *)(lVar18 + 0xc) & 1) != 0) {
    (this->builder).generatingOpCodeForSpecConst = true;
  }
  IVar8 = createImageTextureFunctionCall(this,&node->super_TIntermOperator);
  if (IVar8 == 0) {
    TVar11 = (node->super_TIntermOperator).op;
    if (TVar11 != EOpDeclare) {
      if (TVar11 == EOpArrayLength) {
        iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])(node);
        lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0xf0))
                           ((long *)CONCAT44(extraout_var_02,iVar6));
        uVar28 = *(uint *)(lVar18 + 8);
        iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])(node);
        pTVar19 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0xf0))
                                     ((long *)CONCAT44(extraout_var_03,iVar6));
        if ((uVar28 & 0x600000) == 0) {
          uVar28 = *(uint *)&pTVar19->field_0x8;
          iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])(node);
          lVar18 = *(long *)CONCAT44(extraout_var_09,iVar6);
          if ((uVar28 >> 0x1b & 1) == 0) {
            plVar21 = (long *)(**(code **)(lVar18 + 0x40))();
            plVar21 = (long *)(**(code **)(*plVar21 + 400))(plVar21);
            (**(code **)(*plVar21 + 0x10))(plVar21,this);
            iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x31])(node);
            plVar21 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x40))
                                        ((long *)CONCAT44(extraout_var_10,iVar6));
            plVar21 = (long *)(**(code **)(*plVar21 + 0x198))(plVar21);
            lVar18 = (**(code **)(*plVar21 + 0x28))(plVar21);
            uVar28 = **(uint **)(*(long *)(lVar18 + 0xc0) + 8);
            IVar8 = spv::Builder::accessChainGetLValue(this_00);
            IVar8 = spv::Builder::createArrayLength(this_00,IVar8,uVar28);
          }
          else {
            pTVar19 = (TType *)(**(code **)(lVar18 + 0xf0))((long *)CONCAT44(extraout_var_09,iVar6))
            ;
            IVar8 = convertGlslangToSpvType(this,pTVar19,forwardReferenceOnly_01);
            IVar8 = spv::Builder::getCooperativeVectorNumComponents(this_00,IVar8);
          }
        }
        else {
          IVar8 = convertGlslangToSpvType(this,pTVar19,forwardReferenceOnly);
          OVar26 = (this->builder).module.idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[IVar8]->opCode;
          if ((OVar26 != OpTypeCooperativeMatrixKHR) && (OVar26 != OpTypeCooperativeMatrixNV)) {
            __assert_fail("builder.isCooperativeMatrixType(typeId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0xa30,
                          "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                         );
          }
          iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])(node);
          lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0xf0))
                             ((long *)CONCAT44(extraout_var_04,iVar6));
          if ((*(byte *)(lVar18 + 10) & 0x40) == 0) {
            (this->builder).generatingOpCodeForSpecConst = true;
            IVar8 = spv::Builder::createCooperativeMatrixLengthNV(this_00,IVar8);
          }
          else {
            IVar8 = spv::Builder::createCooperativeMatrixLengthKHR(this_00,IVar8);
          }
        }
        if (this->glslangIntermediate->source == EShSourceGlsl) {
          bVar5 = (this->builder).generatingOpCodeForSpecConst;
          IVar9 = spv::Builder::makeIntType(this_00,0x20);
          if (bVar5 == true) {
            IVar10 = spv::Builder::makeIntConstant(this_00,0,false);
            IVar8 = spv::Builder::createBinOp(this_00,OpIAdd,IVar9,IVar8,IVar10);
          }
          else {
            IVar8 = spv::Builder::createUnaryOp(this_00,OpBitcast,IVar9,IVar8);
          }
        }
        goto LAB_003b2d9b;
      }
      resultType.invertedType = &invertedType;
      invertedType = 0;
      resultType.node = &node_local;
      IVar8 = invertedType;
      resultType.this = this;
      if (TVar11 == EOpInterpolateAtCentroid) {
        iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])(node);
        plVar21 = (long *)CONCAT44(extraout_var_06,iVar6);
        lVar18 = (**(code **)(*plVar21 + 0x80))(plVar21);
        IVar8 = 0;
        if ((lVar18 != 0) &&
           (lVar18 = (**(code **)(*plVar21 + 0x80))(plVar21), *(int *)(lVar18 + 0xb8) == 0x36)) {
          plVar21 = (long *)(**(code **)(*plVar21 + 0xa0))(plVar21);
          plVar21 = (long *)(**(code **)(*plVar21 + 400))(plVar21);
          pTVar19 = (TType *)(**(code **)(*plVar21 + 0xf0))(plVar21);
          IVar8 = convertGlslangToSpvType(this,pTVar19,forwardReferenceOnly_00);
        }
      }
      invertedType = IVar8;
      spv::Builder::clearAccessChain(this_00);
      IVar8 = invertedType;
      iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])();
      plVar21 = (long *)CONCAT44(extraout_var_07,iVar6);
      if (IVar8 != 0) {
        plVar21 = (long *)(**(code **)(*plVar21 + 0x40))(plVar21);
        plVar21 = (long *)(**(code **)(*plVar21 + 400))(plVar21);
      }
      (**(code **)(*plVar21 + 0x10))(plVar21,this);
      lvalueCoherentFlags._0_2_ = 0;
      TVar11 = (node_local->super_TIntermOperator).op;
      if (((TVar11 - EOpRayQueryTerminate < 0x14) &&
          ((0xc806dU >> (TVar11 - EOpRayQueryTerminate & 0x1f) & 1) != 0)) ||
         (TVar11 - EOpAtomicCounterIncrement < 3)) {
LAB_003b31a1:
        local_124 = spv::Builder::accessChainGetLValue(this_00);
        pTVar19 = (TType *)&(this->builder).accessChain;
        spv::Builder::AccessChain::AccessChain((AccessChain *)&constants,(AccessChain *)pTVar19);
        lvalueCoherentFlags._0_2_ = local_48[0]._0_2_;
        spv::Builder::AccessChain::~AccessChain((AccessChain *)&constants);
        plVar20 = (long *)(**(code **)(*plVar21 + 0x18))(plVar21);
        pTVar22 = (TGlslangToSpvTraverser *)(**(code **)(*plVar20 + 0xf0))(plVar20);
        CVar12 = TranslateCoherent(pTVar22,pTVar19);
        constants.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Tp_alloc_type.allocator._0_2_ = CVar12._0_2_;
        spv::Builder::AccessChain::CoherentFlags::operator|=
                  (&lvalueCoherentFlags,(CoherentFlags *)&constants);
      }
      else {
        if (TVar11 == EOpSpirvInst) {
          plVar20 = (long *)(**(code **)(*plVar21 + 0x18))(plVar21);
          lVar18 = (**(code **)(*plVar20 + 0x108))(plVar20);
          if ((*(byte *)(lVar18 + 0xf) & 8) == 0) {
            TVar11 = (node_local->super_TIntermOperator).op;
            goto LAB_003b3184;
          }
          goto LAB_003b31a1;
        }
        if (TVar11 == EOpInterpolateAtCentroid) {
          if (this->glslangIntermediate->source != EShSourceHlsl) goto LAB_003b31a1;
        }
        else {
LAB_003b3184:
          if (((TVar11 - EOpHitObjectRecordEmptyNV < 0x17) &&
              ((0x6ffffdU >> (TVar11 - EOpHitObjectRecordEmptyNV & 0x1f) & 1) != 0)) ||
             ((TVar11 - EOpHitObjectGetClusterIdNV < 0xe &&
              ((0x3301U >> (TVar11 - EOpHitObjectGetClusterIdNV & 0x1f) & 1) != 0))))
          goto LAB_003b31a1;
        }
        plVar20 = (long *)(**(code **)(*plVar21 + 0x18))(plVar21);
        lVar18 = (**(code **)(*plVar20 + 0x108))(plVar20);
        local_124 = 0;
        if ((*(byte *)(lVar18 + 0xf) & 0x10) == 0) {
          iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          pTVar19 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0xf0))
                                       ((long *)CONCAT44(extraout_var_08,iVar6));
          local_124 = accessChainLoad(this,pTVar19);
        }
      }
      TVar3 = (node_local->super_TIntermOperator).operationPrecision;
      TVar24 = *(uint *)&(node_local->super_TIntermOperator).super_TIntermTyped.type.qualifier.
                         field_0x8 >> 0x19 & 7;
      if (TVar3 != EpqNone) {
        TVar24 = TVar3;
      }
      local_118 = 0;
      DVar17 = DecorationMax;
      if (TVar24 - EpqLow < 2) {
        DVar17 = DecorationRelaxedPrecision;
      }
      iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_11,iVar6));
      decorations.noContraction = DecorationNoContraction;
      if ((*(ulong *)(lVar18 + 8) >> 0x24 & 1) == 0) {
        decorations.noContraction = DecorationMax;
      }
      iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      qualifier = (TQualifier *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 0x58))
                            ((long *)CONCAT44(extraout_var_12,iVar6));
      decorations.nonUniform = TranslateNonUniformDecoration(this,qualifier);
      TVar11 = (node_local->super_TIntermOperator).op;
      decorations.precision = DVar17;
      IVar8 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
      iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      local_100 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar6) + 0x38))
                            ((long *)CONCAT44(extraout_var_13,iVar6));
      iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])();
      TVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0x100))
                         ((long *)CONCAT44(extraout_var_14,iVar6));
      pTVar22 = (TGlslangToSpvTraverser *)(ulong)IVar8;
      if ((this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[(long)pTVar22]->opCode == OpTypeVector) {
        local_110 = this;
        local_118 = spv::Builder::getNumTypeConstituents(this_00,IVar8);
        this = local_110;
      }
      IVar9 = local_124;
      switch(TVar11) {
      case EOpConvNumeric:
        uVar30 = TVar13 - EbtInt8;
        type = (TBasicType)local_100;
        uVar28 = type - EbtFloat;
        OVar25 = OpConvertSToF;
        if ((uVar30 & 0xfffffff9) != 0) {
          OVar25 = OpNop;
        }
        if (2 < uVar28) {
          OVar25 = OpNop;
        }
        uVar14 = TVar13 - EbtUint8;
        OVar26 = OpConvertUToF;
        if ((uVar14 & 0xfffffff9) != 0) {
          OVar26 = OVar25;
        }
        if (2 < uVar28) {
          OVar26 = OVar25;
        }
        uVar27 = TVar13 - EbtFloat;
        uVar29 = type - EbtInt8;
        if (uVar27 < 3) {
          if ((uVar29 & 0xfffffff9) == 0) {
            OVar26 = OpConvertFToS;
          }
          if ((type - EbtUint8 & 0xfffffff9) == 0) {
            OVar26 = OpConvertFToU;
          }
        }
        uVar31 = type - EbtUint8;
        if (((uVar30 | uVar29) & 0xfffffff9) == 0) {
          OVar26 = OpSConvert;
        }
        if (((uVar31 | uVar14) & 0xfffffff9) == 0) {
          OVar26 = OpUConvert;
        }
        local_110 = pTVar22;
        if ((2 < uVar28) || (2 < uVar27)) {
LAB_003b3522:
          bVar5 = (uVar14 & 0xfffffff9) == 0;
          bVar33 = (uVar30 & 0xfffffff9) == 0;
          local_114 = CONCAT31(local_114._1_3_,bVar33 || bVar5);
          if (bVar33 || bVar5) {
            bVar5 = (uVar31 & 0xfffffff9) == 0;
            if (((uVar29 & 0xfffffff9) != 0 && !bVar5) || (((uVar14 & 0xfffffff9) == 0) == bVar5))
            goto LAB_003b35e9;
            uVar15 = glslang::GetNumBits(TVar13);
            uVar16 = glslang::GetNumBits(type);
            if (uVar15 != uVar16) {
              uVar15 = glslang::GetNumBits((TBasicType)local_100);
              if ((uVar30 & 0xfffffff9) == 0) {
                IVar8 = spv::Builder::makeIntType(this_00,uVar15);
                OVar26 = OpSConvert;
              }
              else {
                IVar8 = spv::Builder::makeUintType(this_00,uVar15);
                OVar26 = OpUConvert;
              }
              OVar25 = (this->builder).module.idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)local_110]->opCode;
              if (OVar25 == OpTypeCooperativeVectorNV) {
                IVar9 = spv::Builder::getCooperativeVectorNumComponents(this_00,(Id)local_110);
                IVar8 = spv::Builder::makeCooperativeVectorTypeNV(this_00,IVar8,IVar9);
              }
              else if ((int)local_118 < 1) {
                if ((OVar25 == OpTypeCooperativeMatrixNV) || (OVar25 == OpTypeCooperativeMatrixKHR))
                {
                  IVar8 = spv::Builder::makeCooperativeMatrixTypeWithSameShape
                                    (this_00,IVar8,(Id)local_110);
                }
              }
              else {
                IVar8 = spv::Builder::makeVectorType(this_00,IVar8,local_118);
              }
              IVar9 = spv::Builder::createUnaryOp(this_00,OVar26,IVar8,local_124);
            }
            type = (TBasicType)local_100;
            if ((this->builder).generatingOpCodeForSpecConst != true) {
              OVar26 = OpBitcast;
              goto LAB_003b35e9;
            }
            uVar15 = glslang::GetNumBits(type);
            IVar10 = spv::Builder::makeUintType(this_00,uVar15);
            IVar8 = (Id)local_110;
            if (uVar15 == 0x40) {
              IVar10 = spv::Builder::makeInt64Constant(this_00,IVar10,0,false);
            }
            else {
              IVar10 = spv::Builder::makeIntConstant(this_00,IVar10,0,false);
            }
            IVar10 = makeSmearedConstant(this,IVar10,local_118);
            OVar26 = OpIAdd;
LAB_003b3fbd:
            IVar8 = spv::Builder::createBinOp(this_00,OVar26,IVar8,IVar9,IVar10);
            goto LAB_003b33f5;
          }
LAB_003b35e9:
          if (type == EbtBool) {
            uVar15 = glslang::GetNumBits(TVar13);
            IVar8 = (Id)local_110;
            if ((char)local_114 == '\0') {
              if (2 < uVar27) {
                __assert_fail("isTypeFloat(operandBasicType)",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                              ,0x1fc7,
                              "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                             );
              }
              if (uVar15 == 0x10) {
                IVar10 = spv::Builder::makeFloat16Constant(this_00,0.0,false);
              }
              else if (uVar15 == 0x20) {
                IVar10 = spv::Builder::makeFloatConstant(this_00,0.0,false);
              }
              else {
                if (uVar15 != 0x40) {
                  __assert_fail("bits == 16",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                                ,0x1fcd,
                                "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                               );
                }
                IVar10 = spv::Builder::makeDoubleConstant(this_00,0.0,false);
              }
              IVar10 = makeSmearedConstant(this,IVar10,local_118);
              OVar26 = OpFUnordNotEqual;
            }
            else {
              IVar10 = spv::Builder::makeUintType(this_00,uVar15);
              if (uVar15 == 0x40) {
                IVar10 = spv::Builder::makeInt64Constant(this_00,IVar10,0,false);
              }
              else {
                IVar10 = spv::Builder::makeIntConstant(this_00,IVar10,0,false);
              }
              IVar10 = makeSmearedConstant(this,IVar10,local_118);
              OVar26 = OpINotEqual;
            }
            goto LAB_003b3fbd;
          }
          IVar8 = (Id)local_110;
          if (TVar13 != EbtBool) {
            if (OVar26 != OpNop) break;
            goto switchD_003b3346_default;
          }
          local_100 = CONCAT44(local_100._4_4_,IVar9);
          uVar15 = glslang::GetNumBits(type);
          if ((uVar29 & 0xfffffff9) == 0 || (uVar31 & 0xfffffff9) == 0) {
            if ((uVar29 & 0xfffffff9) == 0) {
              IVar9 = spv::Builder::makeIntType(this_00,uVar15);
            }
            else {
              IVar9 = spv::Builder::makeUintType(this_00,uVar15);
            }
            if (uVar15 == 0x40) {
              IVar8 = spv::Builder::makeInt64Constant(this_00,IVar9,0,false);
              local_114 = spv::Builder::makeInt64Constant(this_00,IVar9,1,false);
            }
            else {
              IVar8 = spv::Builder::makeIntConstant(this_00,IVar9,0,false);
              local_114 = spv::Builder::makeIntConstant(this_00,IVar9,1,false);
            }
          }
          else {
            if (2 < uVar28) {
              __assert_fail("isTypeFloat(resultBasicType)",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0x1fe1,
                            "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                           );
            }
            if (uVar15 == 0x10) {
              IVar8 = spv::Builder::makeFloat16Constant(this_00,0.0,false);
              local_114 = spv::Builder::makeFloat16Constant(this_00,1.0,false);
            }
            else if (uVar15 == 0x20) {
              IVar8 = spv::Builder::makeFloatConstant(this_00,0.0,false);
              local_114 = spv::Builder::makeFloatConstant(this_00,1.0,false);
            }
            else {
              if (uVar15 != 0x40) {
                __assert_fail("bits == 16",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                              ,0x1fe9,
                              "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                             );
              }
              IVar8 = spv::Builder::makeDoubleConstant(this_00,0.0,false);
              local_114 = spv::Builder::makeDoubleConstant(this_00,1.0,false);
            }
          }
          uVar28 = local_118;
          IVar8 = makeSmearedConstant(this,IVar8,local_118);
          IVar9 = makeSmearedConstant(this,local_114,uVar28);
          IVar8 = spv::Builder::createTriOp
                            (this_00,OpSelect,(Id)local_110,(Id)local_100,IVar9,IVar8);
          goto LAB_003b33d8;
        }
        if ((this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[(long)pTVar22]->opCode != OpTypeMatrix) {
          OVar26 = OpFConvert;
          goto LAB_003b3522;
        }
        IVar8 = createUnaryMatrixOperation(this,OpFConvert,&decorations,IVar8,local_124,TVar13);
        goto LAB_003b33f5;
      case EOpConvUint64ToPtr:
        OVar26 = OpConvertUToPtr;
        break;
      case EOpConvPtrToUint64:
        OVar26 = OpConvertPtrToU;
        break;
      case EOpConvUvec2ToPtr:
      case EOpConvPtrToUvec2:
        OVar26 = OpBitcast;
        break;
      default:
        goto switchD_003b3346_default;
      }
      IVar8 = spv::Builder::createUnaryOp(this_00,OVar26,IVar8,IVar9);
LAB_003b33d8:
      IVar8 = spv::Builder::setPrecision(this_00,IVar8,DVar17);
      anon_unknown_0::OpDecorations::addNonUniform(&decorations,this_00,IVar8);
LAB_003b33f5:
      if (IVar8 == 0) {
switchD_003b3346_default:
        TVar11 = (node_local->super_TIntermOperator).op;
        IVar8 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
        iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        TVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar6) + 0x100))
                           ((long *)CONCAT44(extraout_var_19,iVar6));
        iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        IVar8 = createUnaryOperation
                          (this,TVar11,&decorations,IVar8,local_124,TVar13,&lvalueCoherentFlags,
                           (TType *)CONCAT44(extraout_var_20,iVar6));
        pTVar4 = node_local;
        if (IVar8 == 0) {
          TVar11 = (node_local->super_TIntermOperator).op;
          if (TVar11 == EOpSpirvInst) {
            __lhs = &node_local->spirvInst;
            bVar5 = std::operator==(&__lhs->set,"");
            if (bVar5) {
              plVar20 = (long *)(**(code **)(*plVar21 + 0x18))(plVar21);
              lVar18 = (**(code **)(*plVar20 + 0x108))(plVar20);
              bVar5 = (*(byte *)(lVar18 + 0xf) & 0x10) != 0;
              uVar28 = local_124;
              if (bVar5) {
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                glslang::TVector<const_glslang::TIntermConstantUnion_*>::TVector(&constants);
                local_38 = (TIntermConstantUnion *)(**(code **)(*plVar21 + 0x28))(plVar21);
                std::
                vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
                ::emplace_back<glslang::TIntermConstantUnion_const*>
                          ((vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
                            *)&constants,&local_38);
                TranslateLiterals((TGlslangToSpvTraverser *)&constants,
                                  (TVector<const_glslang::TIntermConstantUnion_*> *)&literals,
                                  literals_00);
                uVar28 = *literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&literals);
              }
              uVar32 = (ulong)!bVar5;
              iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x20])();
              OVar26 = (pTVar4->spirvInst).id;
              if (iVar6 == 0) {
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)((ulong)uVar28 << 0x20 | uVar32);
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
                _M_range_initialize<spv::IdImmediate_const*>
                          ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&constants,
                           &literals);
                spv::Builder::createNoResultOp
                          (this_00,OVar26,
                           (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&constants
                          );
                std::_Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
                ~_Vector_base((_Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                              &constants);
                IVar8 = 0;
              }
              else {
                IVar8 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)((ulong)uVar28 << 0x20 | uVar32);
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
                _M_range_initialize<spv::IdImmediate_const*>
                          ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&constants,
                           &literals);
                IVar8 = spv::Builder::createOp
                                  (this_00,OVar26,IVar8,
                                   (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                                   &constants);
                std::_Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::
                ~_Vector_base((_Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                              &constants);
              }
            }
            else {
              IVar8 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
              bVar5 = std::operator==(&__lhs->set,"GLSL.std.450");
              if (bVar5) {
                IVar9 = this->stdBuiltins;
              }
              else {
                IVar9 = getExtBuiltins(this,(pTVar4->spirvInst).set._M_dataplus._M_p);
              }
              iVar6 = (pTVar4->spirvInst).id;
              literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(literals.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,local_124);
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_range_initialize<unsigned_int_const*>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&constants,&literals);
              IVar8 = spv::Builder::createBuiltinCall
                                (this_00,IVar8,IVar9,iVar6,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
            }
            iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x20])();
            if (iVar6 == 0) goto LAB_003b2db0;
            if (IVar8 != 0) goto LAB_003b3741;
            TVar11 = (node_local->super_TIntermOperator).op;
          }
          if (TVar11 - EOpPostIncrement < 4) {
            iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x20])(node_local);
            if (iVar6 == 1) {
              IVar8 = spv::Builder::makeFloatConstant(this_00,1.0,false);
            }
            else {
              iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x20])();
              if (iVar6 == 2) {
                IVar8 = spv::Builder::makeDoubleConstant(this_00,1.0,false);
              }
              else {
                iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x20])();
                if (iVar6 == 3) {
                  IVar8 = spv::Builder::makeFloat16Constant(this_00,1.0,false);
                }
                else {
                  iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode
                            ._vptr_TIntermNode[0x20])();
                  if ((iVar6 == 4) ||
                     (iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                super_TIntermNode._vptr_TIntermNode[0x20])(), iVar6 == 5)) {
                    IVar8 = spv::Builder::makeInt8Constant(this_00,1,false);
                  }
                  else {
                    iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                              super_TIntermNode._vptr_TIntermNode[0x20])();
                    if ((iVar6 == 6) ||
                       (iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                  super_TIntermNode._vptr_TIntermNode[0x20])(), iVar6 == 7)) {
                      IVar8 = spv::Builder::makeInt16Constant(this_00,1,false);
                    }
                    else {
                      iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                super_TIntermNode._vptr_TIntermNode[0x20])();
                      if ((iVar6 == 10) ||
                         (iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                    super_TIntermNode._vptr_TIntermNode[0x20])(), iVar6 == 0xb)) {
                        IVar8 = spv::Builder::makeInt64Constant(this_00,1,false);
                      }
                      else {
                        IVar8 = spv::Builder::makeIntConstant(this_00,1,false);
                      }
                    }
                  }
                }
              }
            }
            TVar11 = (node_local->super_TIntermOperator).op;
            iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x1e])();
            IVar9 = convertGlslangToSpvType
                              (this,(TType *)CONCAT44(extraout_var_22,iVar6),forwardReferenceOnly_02
                              );
            iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x1e])();
            TVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar6) + 0x38))
                               ((long *)CONCAT44(extraout_var_23,iVar6));
            IVar8 = createBinaryOperation
                              (this,((TVar11 & ~EOpScope) != EOpPostIncrement) + EOpAdd,&decorations
                               ,IVar9,local_124,IVar8,TVar13,true);
            if (IVar8 == 0) {
              __assert_fail("result != spv::NoResult",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0xb10,
                            "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                           );
            }
            pAVar1 = &(this->builder).accessChain;
            spv::Builder::AccessChain::AccessChain((AccessChain *)&constants,pAVar1);
            DVar17 = TranslateNonUniformDecoration(this,local_48);
            spv::Builder::accessChainStore(this_00,IVar8,DVar17,MaskNone,Max,0);
            spv::Builder::AccessChain::~AccessChain((AccessChain *)&constants);
            spv::Builder::clearAccessChain(this_00);
            TVar11 = (node_local->super_TIntermOperator).op;
            (this->builder).accessChain.isRValue = true;
            if ((TVar11 & ~EOpSequence) == EOpPreIncrement) {
              pAVar1->base = IVar8;
            }
            else {
              pAVar1->base = local_124;
            }
            goto LAB_003b2db0;
          }
          if (TVar11 == EOpEmitStreamVertex) {
            OVar26 = OpEmitStreamVertex;
          }
          else {
            if (TVar11 != EOpEndStreamPrimitive) {
              if (TVar11 == EOpCreateTensorLayoutNV) {
                IVar8 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
                OVar26 = OpCreateTensorLayoutNV;
              }
              else {
                if (TVar11 != EOpCreateTensorViewNV) {
                  if (TVar11 == EOpRayQueryTerminate) {
                    OVar26 = OpRayQueryTerminateKHR;
                  }
                  else if (TVar11 == EOpRayQueryConfirmIntersection) {
                    OVar26 = OpRayQueryConfirmIntersectionKHR;
                  }
                  else if (TVar11 == EOpHitObjectRecordEmptyNV) {
                    OVar26 = OpHitObjectRecordEmptyNV;
                  }
                  else if (TVar11 == EOpReorderThreadNV) {
                    OVar26 = OpReorderThreadWithHitObjectNV;
                  }
                  else {
                    if (TVar11 != EOpAssumeEXT) {
                      this_01 = this->logger;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&constants,"unknown glslang unary",
                                 (allocator<char> *)&literals);
                      spv::SpvBuildLogger::missingFunctionality(this_01,(string *)&constants);
                      std::__cxx11::string::_M_dispose();
                      bVar5 = true;
                      goto LAB_003b2db2;
                    }
                    spv::Builder::addCapability(this_00,CapabilityExpectAssumeKHR);
                    spv::Builder::addExtension(this_00,"SPV_KHR_expect_assume");
                    OVar26 = OpAssumeTrueKHR;
                  }
                  goto LAB_003b3c9a;
                }
                IVar8 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
                OVar26 = OpCreateTensorViewNV;
              }
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
              IVar8 = spv::Builder::createOp
                                (this_00,OVar26,IVar8,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
              goto LAB_003b2d9b;
            }
            OVar26 = OpEndStreamPrimitive;
          }
LAB_003b3c9a:
          spv::Builder::createNoResultOp(this_00,OVar26,local_124);
          goto LAB_003b2db0;
        }
      }
      else {
        iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        if ((*(byte *)(CONCAT44(extraout_var_15,iVar6) + 10) & 0x40) != 0) {
          iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          plVar21 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 0x18))
                                      ((long *)CONCAT44(extraout_var_16,iVar6));
          lVar18 = (**(code **)(*plVar21 + 0xf0))(plVar21);
          if ((*(byte *)(lVar18 + 10) & 0x40) != 0) {
            iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[3])();
            lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar6) + 0xf0))
                               ((long *)CONCAT44(extraout_var_17,iVar6));
            iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x31])();
            plVar21 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_18,iVar6) + 0x18))
                                        ((long *)CONCAT44(extraout_var_18,iVar6));
            lVar23 = (**(code **)(*plVar21 + 0xf0))(plVar21);
            if (((*(uint *)(lVar23 + 8) ^ *(uint *)(lVar18 + 8)) & 0x3800000) != 0) {
              spv::Builder::addCapability(this_00,CapabilityCooperativeMatrixConversionsNV);
              spv::Builder::addExtension(this_00,"SPV_NV_cooperative_matrix2");
            }
          }
        }
      }
LAB_003b3741:
      DVar17 = decorations.precision;
      if (invertedType != 0) {
        iVar6 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        IVar8 = createInvertedSwizzle
                          (this,DVar17,(TIntermTyped *)CONCAT44(extraout_var_21,iVar6),IVar8);
        anon_unknown_0::OpDecorations::addNonUniform(&decorations,this_00,IVar8);
      }
      goto LAB_003b2d9b;
    }
    spv::Builder::clearAccessChain(this_00);
    iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x31])(node);
    (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x10))
              ((long *)CONCAT44(extraout_var_05,iVar6),this);
    spv::Builder::clearAccessChain(this_00);
  }
  else {
LAB_003b2d9b:
    spv::Builder::clearAccessChain(this_00);
    (this->builder).accessChain.isRValue = true;
    (this->builder).accessChain.base = IVar8;
  }
LAB_003b2db0:
  bVar5 = false;
LAB_003b2db2:
  (this->builder).generatingOpCodeForSpecConst = bVar2;
  return bVar5;
}

Assistant:

bool TGlslangToSpvTraverser::visitUnary(glslang::TVisit /* visit */, glslang::TIntermUnary* node)
{
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (node->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();

    spv::Id result = spv::NoResult;

    // try texturing first
    result = createImageTextureFunctionCall(node);
    if (result != spv::NoResult) {
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // Non-texturing.

    if (node->getOp() == glslang::EOpArrayLength) {
        // Quite special; won't want to evaluate the operand.

        // Currently, the front-end does not allow .length() on an array until it is sized,
        // except for the last block membeor of an SSBO.
        // TODO: If this changes, link-time sized arrays might show up here, and need their
        // size extracted.

        // Normal .length() would have been constant folded by the front-end.
        // So, this has to be block.lastMember.length().
        // SPV wants "block" and member number as the operands, go get them.

        spv::Id length;
        if (node->getOperand()->getType().isCoopMat()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            assert(builder.isCooperativeMatrixType(typeId));

            if (node->getOperand()->getType().isCoopMatKHR()) {
                length = builder.createCooperativeMatrixLengthKHR(typeId);
            } else {
                spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
                length = builder.createCooperativeMatrixLengthNV(typeId);
            }
        } else if (node->getOperand()->getType().isCoopVecNV()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            length = builder.getCooperativeVectorNumComponents(typeId);
        } else {
            glslang::TIntermTyped* block = node->getOperand()->getAsBinaryNode()->getLeft();
            block->traverse(this);
            unsigned int member = node->getOperand()->getAsBinaryNode()->getRight()->getAsConstantUnion()
                ->getConstArray()[0].getUConst();
            length = builder.createArrayLength(builder.accessChainGetLValue(), member);
        }

        // GLSL semantics say the result of .length() is an int, while SPIR-V says
        // signedness must be 0. So, convert from SPIR-V unsigned back to GLSL's
        // AST expectation of a signed result.
        if (glslangIntermediate->getSource() == glslang::EShSourceGlsl) {
            if (builder.isInSpecConstCodeGenMode()) {
                length = builder.createBinOp(spv::OpIAdd, builder.makeIntType(32), length, builder.makeIntConstant(0));
            } else {
                length = builder.createUnaryOp(spv::OpBitcast, builder.makeIntType(32), length);
            }
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(length);

        return false;
    }

    // Force variable declaration - Debug Mode Only
    if (node->getOp() == glslang::EOpDeclare) {
        builder.clearAccessChain();
        node->getOperand()->traverse(this);
        builder.clearAccessChain();
        return false;
    }

    // Start by evaluating the operand

    // Does it need a swizzle inversion?  If so, evaluation is inverted;
    // operate first on the swizzle base, then apply the swizzle.
    spv::Id invertedType = spv::NoType;
    auto resultType = [&invertedType, &node, this](){ return invertedType != spv::NoType ?
        invertedType : convertGlslangToSpvType(node->getType()); };
    if (node->getOp() == glslang::EOpInterpolateAtCentroid)
        invertedType = getInvertedSwizzleType(*node->getOperand());

    builder.clearAccessChain();
    TIntermNode *operandNode;
    if (invertedType != spv::NoType)
        operandNode = node->getOperand()->getAsBinaryNode()->getLeft();
    else
        operandNode = node->getOperand();

    operandNode->traverse(this);

    spv::Id operand = spv::NoResult;

    spv::Builder::AccessChain::CoherentFlags lvalueCoherentFlags;

    const auto hitObjectOpsWithLvalue = [](glslang::TOperator op) {
        switch(op) {
            case glslang::EOpReorderThreadNV:
            case glslang::EOpHitObjectGetCurrentTimeNV:
            case glslang::EOpHitObjectGetHitKindNV:
            case glslang::EOpHitObjectGetPrimitiveIndexNV:
            case glslang::EOpHitObjectGetGeometryIndexNV:
            case glslang::EOpHitObjectGetInstanceIdNV:
            case glslang::EOpHitObjectGetInstanceCustomIndexNV:
            case glslang::EOpHitObjectGetObjectRayDirectionNV:
            case glslang::EOpHitObjectGetObjectRayOriginNV:
            case glslang::EOpHitObjectGetWorldRayDirectionNV:
            case glslang::EOpHitObjectGetWorldRayOriginNV:
            case glslang::EOpHitObjectGetWorldToObjectNV:
            case glslang::EOpHitObjectGetObjectToWorldNV:
            case glslang::EOpHitObjectGetRayTMaxNV:
            case glslang::EOpHitObjectGetRayTMinNV:
            case glslang::EOpHitObjectIsEmptyNV:
            case glslang::EOpHitObjectIsHitNV:
            case glslang::EOpHitObjectIsMissNV:
            case glslang::EOpHitObjectRecordEmptyNV:
            case glslang::EOpHitObjectGetShaderBindingTableRecordIndexNV:
            case glslang::EOpHitObjectGetShaderRecordBufferHandleNV:
            case glslang::EOpHitObjectGetClusterIdNV:
            case glslang::EOpHitObjectGetSpherePositionNV:
            case glslang::EOpHitObjectGetSphereRadiusNV:
            case glslang::EOpHitObjectIsSphereHitNV:
            case glslang::EOpHitObjectIsLSSHitNV:
                return true;
            default:
                return false;
        }
    };

    if (node->getOp() == glslang::EOpAtomicCounterIncrement ||
        node->getOp() == glslang::EOpAtomicCounterDecrement ||
        node->getOp() == glslang::EOpAtomicCounter          ||
        (node->getOp() == glslang::EOpInterpolateAtCentroid &&
          glslangIntermediate->getSource() != glslang::EShSourceHlsl)  ||
        node->getOp() == glslang::EOpRayQueryProceed        ||
        node->getOp() == glslang::EOpRayQueryGetRayTMin     ||
        node->getOp() == glslang::EOpRayQueryGetRayFlags    ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayOrigin ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayDirection ||
        node->getOp() == glslang::EOpRayQueryGetIntersectionCandidateAABBOpaque ||
        node->getOp() == glslang::EOpRayQueryTerminate ||
        node->getOp() == glslang::EOpRayQueryConfirmIntersection ||
        (node->getOp() == glslang::EOpSpirvInst && operandNode->getAsTyped()->getQualifier().isSpirvByReference()) ||
        hitObjectOpsWithLvalue(node->getOp())) {
        operand = builder.accessChainGetLValue(); // Special case l-value operands
        lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
        lvalueCoherentFlags |= TranslateCoherent(operandNode->getAsTyped()->getType());
    } else if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
        // Will be translated to a literal value, make a placeholder here
        operand = spv::NoResult;
    } else {
        operand = accessChainLoad(node->getOperand()->getType());
    }

    OpDecorations decorations = { TranslatePrecisionDecoration(node->getOperationPrecision()),
                                  TranslateNoContractionDecoration(node->getType().getQualifier()),
                                  TranslateNonUniformDecoration(node->getType().getQualifier()) };

    // it could be a conversion
    if (! result) {
        result = createConversion(node->getOp(), decorations, resultType(), operand,
            node->getType().getBasicType(), node->getOperand()->getBasicType());
        if (result) {
            if (node->getType().isCoopMatKHR() && node->getOperand()->getAsTyped()->getType().isCoopMatKHR() &&
                !node->getAsTyped()->getType().sameCoopMatUse(node->getOperand()->getAsTyped()->getType())) {
                // Conversions that change use need CapabilityCooperativeMatrixConversionsNV
                builder.addCapability(spv::CapabilityCooperativeMatrixConversionsNV);
                builder.addExtension(spv::E_SPV_NV_cooperative_matrix2);
            }
        }
    }

    // if not, then possibly an operation
    if (! result)
        result = createUnaryOperation(node->getOp(), decorations, resultType(), operand,
            node->getOperand()->getBasicType(), lvalueCoherentFlags, node->getType());

    // it could be attached to a SPIR-V intruction
    if (!result) {
        if (node->getOp() == glslang::EOpSpirvInst) {
            const auto& spirvInst = node->getSpirvInstruction();
            if (spirvInst.set == "") {
                spv::IdImmediate idImmOp = {true, operand};
                if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
                    // Translate the constant to a literal value
                    std::vector<unsigned> literals;
                    glslang::TVector<const glslang::TIntermConstantUnion*> constants;
                    constants.push_back(operandNode->getAsConstantUnion());
                    TranslateLiterals(constants, literals);
                    idImmOp = {false, literals[0]};
                }

                if (node->getBasicType() == glslang::EbtVoid)
                    builder.createNoResultOp(static_cast<spv::Op>(spirvInst.id), {idImmOp});
                else
                    result = builder.createOp(static_cast<spv::Op>(spirvInst.id), resultType(), {idImmOp});
            } else {
                result = builder.createBuiltinCall(
                    resultType(), spirvInst.set == "GLSL.std.450" ? stdBuiltins : getExtBuiltins(spirvInst.set.c_str()),
                    spirvInst.id, {operand});
            }

            if (node->getBasicType() == glslang::EbtVoid)
                return false; // done with this node
        }
    }

    if (result) {
        if (invertedType) {
            result = createInvertedSwizzle(decorations.precision, *node->getOperand(), result);
            decorations.addNonUniform(builder, result);
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // it must be a special case, check...
    switch (node->getOp()) {
    case glslang::EOpPostIncrement:
    case glslang::EOpPostDecrement:
    case glslang::EOpPreIncrement:
    case glslang::EOpPreDecrement:
        {
            // we need the integer value "1" or the floating point "1.0" to add/subtract
            spv::Id one = 0;
            if (node->getBasicType() == glslang::EbtFloat)
                one = builder.makeFloatConstant(1.0F);
            else if (node->getBasicType() == glslang::EbtDouble)
                one = builder.makeDoubleConstant(1.0);
            else if (node->getBasicType() == glslang::EbtFloat16)
                one = builder.makeFloat16Constant(1.0F);
            else if (node->getBasicType() == glslang::EbtInt8  || node->getBasicType() == glslang::EbtUint8)
                one = builder.makeInt8Constant(1);
            else if (node->getBasicType() == glslang::EbtInt16 || node->getBasicType() == glslang::EbtUint16)
                one = builder.makeInt16Constant(1);
            else if (node->getBasicType() == glslang::EbtInt64 || node->getBasicType() == glslang::EbtUint64)
                one = builder.makeInt64Constant(1);
            else
                one = builder.makeIntConstant(1);
            glslang::TOperator op;
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPostIncrement)
                op = glslang::EOpAdd;
            else
                op = glslang::EOpSub;

            spv::Id result = createBinaryOperation(op, decorations,
                                                   convertGlslangToSpvType(node->getType()), operand, one,
                                                   node->getType().getBasicType());
            assert(result != spv::NoResult);

            // The result of operation is always stored, but conditionally the
            // consumed result.  The consumed result is always an r-value.
            builder.accessChainStore(result,
                                     TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags));
            builder.clearAccessChain();
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPreDecrement)
                builder.setAccessChainRValue(result);
            else
                builder.setAccessChainRValue(operand);
        }

        return false;

    case glslang::EOpAssumeEXT:
        builder.addCapability(spv::CapabilityExpectAssumeKHR);
        builder.addExtension(spv::E_SPV_KHR_expect_assume);
        builder.createNoResultOp(spv::OpAssumeTrueKHR, operand);
        return false;
    case glslang::EOpEmitStreamVertex:
        builder.createNoResultOp(spv::OpEmitStreamVertex, operand);
        return false;
    case glslang::EOpEndStreamPrimitive:
        builder.createNoResultOp(spv::OpEndStreamPrimitive, operand);
        return false;
    case glslang::EOpRayQueryTerminate:
        builder.createNoResultOp(spv::OpRayQueryTerminateKHR, operand);
        return false;
    case glslang::EOpRayQueryConfirmIntersection:
        builder.createNoResultOp(spv::OpRayQueryConfirmIntersectionKHR, operand);
        return false;
    case glslang::EOpReorderThreadNV:
        builder.createNoResultOp(spv::OpReorderThreadWithHitObjectNV, operand);
        return false;
    case glslang::EOpHitObjectRecordEmptyNV:
        builder.createNoResultOp(spv::OpHitObjectRecordEmptyNV, operand);
        return false;

    case glslang::EOpCreateTensorLayoutNV:
        result = builder.createOp(spv::OpCreateTensorLayoutNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    case glslang::EOpCreateTensorViewNV:
        result = builder.createOp(spv::OpCreateTensorViewNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    default:
        logger->missingFunctionality("unknown glslang unary");
        return true;  // pick up operand as placeholder result
    }
}